

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Double_Window.cxx
# Opt level: O1

void __thiscall Fl_Double_Window::hide(Fl_Double_Window *this)

{
  Fl_X *pFVar1;
  
  pFVar1 = (this->super_Fl_Window).i;
  if ((pFVar1 != (Fl_X *)0x0) && (pFVar1->other_xid != 0)) {
    if (use_xdbe == '\x01') {
      XdbeDeallocateBackBufferName();
    }
    else {
      XFreePixmap(fl_display);
    }
  }
  Fl_Window::hide(&this->super_Fl_Window);
  return;
}

Assistant:

void Fl_Double_Window::hide() {
  Fl_X* myi = Fl_X::i(this);
  if (myi && myi->other_xid) {
#if USE_XDBE
    if (use_xdbe) {
      XdbeDeallocateBackBufferName(fl_display, myi->other_xid);
    }
    else
#endif
      fl_delete_offscreen(myi->other_xid);
  }
  Fl_Window::hide();
}